

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::TraverseSchema::checkElemDeclValueConstraint
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,XMLCh *valConstraint,
          ComplexTypeInfo *typeInfo,DatatypeValidator *validator)

{
  short *psVar1;
  short sVar2;
  char16_t cVar3;
  char16_t cVar4;
  XMLStringPool *pXVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char16_t *toDelete;
  char16_t *pcVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char16_t *pcVar11;
  MemoryManager *pMVar12;
  size_t sVar13;
  ArrayJanitor<char16_t> tempCanonical;
  ArrayJanitor<char16_t> local_40;
  XMLCh *pXVar9;
  undefined4 extraout_var_01;
  
  if (validator == (DatatypeValidator *)0x0) {
    bVar6 = false;
    goto LAB_0032f44b;
  }
  if (validator->fType == ID) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x5c,
                      ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,valConstraint,
                      (XMLCh *)0x0,(XMLCh *)0x0);
  }
  sVar2 = validator->fWhiteSpace;
  if (sVar2 == 1) {
    bVar6 = XMLString::isWSReplaced(valConstraint);
LAB_0032f1be:
    if (bVar6 == false) {
      pMVar12 = this->fMemoryManager;
      if (valConstraint == (XMLCh *)0x0) {
        pXVar9 = (XMLCh *)0x0;
      }
      else {
        sVar13 = 0;
        do {
          psVar1 = (short *)((long)valConstraint + sVar13);
          sVar13 = sVar13 + 2;
        } while (*psVar1 != 0);
        iVar7 = (*pMVar12->_vptr_MemoryManager[3])(pMVar12,sVar13);
        pXVar9 = (XMLCh *)CONCAT44(extraout_var,iVar7);
        memcpy(pXVar9,valConstraint,sVar13);
        pMVar12 = this->fMemoryManager;
      }
      ArrayJanitor<char16_t>::ArrayJanitor(&local_40,pXVar9,pMVar12);
      if (sVar2 == 1) {
        XMLString::replaceWS(pXVar9,this->fMemoryManager);
      }
      else if (sVar2 == 2) {
        XMLString::collapseWS(pXVar9,this->fMemoryManager);
      }
      pXVar5 = this->fStringPool;
      uVar8 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5,pXVar9);
      iVar7 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar8);
      valConstraint = (XMLCh *)CONCAT44(extraout_var_00,iVar7);
      ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
    }
  }
  else if (sVar2 == 2) {
    bVar6 = XMLString::isWSCollapsed(valConstraint);
    goto LAB_0032f1be;
  }
  (*(validator->super_XSerializable)._vptr_XSerializable[8])
            (validator,valConstraint,0,this->fMemoryManager);
  iVar7 = (*(validator->super_XSerializable)._vptr_XSerializable[7])
                    (validator,valConstraint,this->fMemoryManager,0);
  toDelete = (char16_t *)CONCAT44(extraout_var_01,iVar7);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,this->fMemoryManager);
  if (toDelete != valConstraint) {
    pcVar10 = valConstraint;
    pcVar11 = toDelete;
    if (valConstraint == (char16_t *)0x0 || toDelete == (char16_t *)0x0) {
      if (toDelete == (char16_t *)0x0) {
        if (valConstraint == (char16_t *)0x0) {
          valConstraint = (char16_t *)0x0;
          goto LAB_0032f354;
        }
LAB_0032f318:
        cVar3 = *pcVar10;
      }
      else {
        cVar3 = *toDelete;
        if ((valConstraint != (char16_t *)0x0) && (cVar3 == L'\0')) goto LAB_0032f318;
      }
      if (cVar3 == L'\0') goto LAB_0032f354;
    }
    else {
      do {
        cVar3 = *pcVar11;
        if (cVar3 == L'\0') goto LAB_0032f318;
        cVar4 = *pcVar10;
        pcVar10 = pcVar10 + 1;
        pcVar11 = pcVar11 + 1;
      } while (cVar3 == cVar4);
    }
    (*(validator->super_XSerializable)._vptr_XSerializable[8])
              (validator,toDelete,0,this->fMemoryManager);
    pXVar5 = this->fStringPool;
    uVar8 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5,toDelete);
    iVar7 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar8);
    valConstraint = (XMLCh *)CONCAT44(extraout_var_02,iVar7);
  }
LAB_0032f354:
  if (elemDecl->fDefaultValue != (XMLCh *)0x0) {
    (*((elemDecl->super_XMLElementDecl).fMemoryManager)->_vptr_MemoryManager[4])();
  }
  if (valConstraint == (char16_t *)0x0) {
    pXVar9 = (XMLCh *)0x0;
  }
  else {
    pMVar12 = (elemDecl->super_XMLElementDecl).fMemoryManager;
    sVar13 = 0;
    do {
      psVar1 = (short *)((long)valConstraint + sVar13);
      sVar13 = sVar13 + 2;
    } while (*psVar1 != 0);
    iVar7 = (*pMVar12->_vptr_MemoryManager[3])(pMVar12,sVar13);
    pXVar9 = (XMLCh *)CONCAT44(extraout_var_03,iVar7);
    memcpy(pXVar9,valConstraint,sVar13);
  }
  elemDecl->fDefaultValue = pXVar9;
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  bVar6 = true;
LAB_0032f44b:
  if (typeInfo != (ComplexTypeInfo *)0x0) {
    uVar8 = typeInfo->fContentType;
    if ((5 < uVar8) || ((0x2cU >> (uVar8 & 0x1f) & 1) == 0)) {
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x37,
                        ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
    if (((((uVar8 & 0xfffffffe) == 2) && (typeInfo->fContentSpec != (ContentSpecNode *)0x0)) &&
        (this->fFullConstraintChecking != false)) &&
       (iVar7 = ContentSpecNode::getMinTotalRange(typeInfo->fContentSpec), iVar7 != 0)) {
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x5e,
                        ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  return bVar6;
}

Assistant:

bool
TraverseSchema::checkElemDeclValueConstraint(const DOMElement* const elem,
                                             SchemaElementDecl* const elemDecl,
                                             const XMLCh* const valConstraint,
                                             ComplexTypeInfo* const typeInfo,
                                             DatatypeValidator* const validator)
{
    bool isValid = false;
    if (validator)
    {
        if (validator->getType() == DatatypeValidator::ID)
            reportSchemaError(
                elem, XMLUni::fgXMLErrDomain, XMLErrs::ElemIDValueConstraint
                , elemDecl->getBaseName(), valConstraint
            );

        try
        {
            const XMLCh* valueToCheck = valConstraint;
            short wsFacet = validator->getWSFacet();
            if((wsFacet == DatatypeValidator::REPLACE && !XMLString::isWSReplaced(valueToCheck)) ||
               (wsFacet == DatatypeValidator::COLLAPSE && !XMLString::isWSCollapsed(valueToCheck)))
            {
                XMLCh* normalizedValue=XMLString::replicate(valueToCheck, fMemoryManager);
                ArrayJanitor<XMLCh> tempURIName(normalizedValue, fMemoryManager);
                if(wsFacet == DatatypeValidator::REPLACE)
                    XMLString::replaceWS(normalizedValue, fMemoryManager);
                else if(wsFacet == DatatypeValidator::COLLAPSE)
                    XMLString::collapseWS(normalizedValue, fMemoryManager);
                valueToCheck=fStringPool->getValueForId(fStringPool->addOrFind(normalizedValue));
            }

            validator->validate(valueToCheck,0,fMemoryManager);

            XMLCh* canonical = (XMLCh*) validator->getCanonicalRepresentation(valueToCheck, fMemoryManager);
            ArrayJanitor<XMLCh> tempCanonical(canonical, fMemoryManager);

            if(!XMLString::equals(canonical, valueToCheck))
            {
                validator->validate(canonical, 0, fMemoryManager);
                valueToCheck=fStringPool->getValueForId(fStringPool->addOrFind(canonical));
            }

            elemDecl->setDefaultValue(valueToCheck);

            isValid = true;
        }
        catch(const XMLException& excep)
        {
            reportSchemaError(elem, excep);
        }
        catch(const OutOfMemoryException&)
        {
            throw;
        }
        catch(...)
        {
            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::DatatypeValidationFailure, valConstraint);
        }
    }

    if (typeInfo)
    {
        int contentSpecType = typeInfo->getContentType();

        if (contentSpecType != SchemaElementDecl::Simple &&
            contentSpecType != SchemaElementDecl::Mixed_Simple &&
            contentSpecType != SchemaElementDecl::Mixed_Complex)
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NotSimpleOrMixedElement, elemDecl->getBaseName());

        if (((contentSpecType == SchemaElementDecl::Mixed_Complex
             || contentSpecType == SchemaElementDecl::Mixed_Simple)
            && !emptiableParticle(typeInfo->getContentSpec())))
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::EmptiableMixedContent, elemDecl->getBaseName());
    }

    return isValid;
}